

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O3

Gia_ManSup_t * Gia_ManSupStart(int nVarsMax)

{
  undefined4 uVar1;
  void *pvVar2;
  uint uVar3;
  Gia_ManSup_t *pGVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  long lVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *puVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int nWords;
  ulong uVar18;
  int iVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  
  if (nVarsMax < 0x15) {
    pGVar4 = (Gia_ManSup_t *)calloc(1,0x48);
    pGVar4->nVarsMax = nVarsMax;
    uVar13 = nVarsMax - 5;
    uVar3 = 1 << ((byte)uVar13 & 0x1f);
    if (nVarsMax < 6) {
      uVar3 = 1;
    }
    uVar18 = (ulong)uVar3;
    pGVar4->nWordsMax = uVar3;
    lVar8 = uVar18 * 4 + 8;
    lVar14 = (long)nVarsMax;
    ppvVar5 = (void **)malloc(lVar8 * lVar14);
    auVar24 = _DAT_008403e0;
    if (0 < nVarsMax) {
      lVar12 = 0;
      uVar16 = uVar13;
      if (nVarsMax < 6) {
        uVar16 = 0;
      }
      lVar26 = (ulong)(uint)nVarsMax - 1;
      auVar20._8_4_ = (int)lVar26;
      auVar20._0_8_ = lVar26;
      auVar20._12_4_ = (int)((ulong)lVar26 >> 0x20);
      auVar20 = auVar20 ^ _DAT_008403e0;
      auVar23 = _DAT_008403d0;
      do {
        auVar25 = auVar23 ^ auVar24;
        lVar26 = auVar23._8_8_;
        if ((bool)(~(auVar25._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar25._0_4_ ||
                    auVar20._4_4_ < auVar25._4_4_) & 1)) {
          *(long *)((long)ppvVar5 + lVar12) =
               (long)ppvVar5 + (auVar23._0_8_ << (ulong)uVar16) * 4 + lVar14 * 8;
        }
        if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
            auVar25._12_4_ <= auVar20._12_4_) {
          *(long *)((long)ppvVar5 + lVar12 + 8) = (long)ppvVar5 + lVar26 * 4 + lVar14 * 8;
        }
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar26 + 2;
        lVar12 = lVar12 + 0x10;
      } while ((ulong)(nVarsMax + 1U >> 1) << 4 != lVar12);
    }
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nSize = nVarsMax;
    pVVar6->nCap = nVarsMax;
    pVVar6->pArray = ppvVar5;
    auVar20 = _DAT_008403e0;
    auVar23 = _DAT_008403d0;
    auVar24 = _DAT_008403c0;
    if (0 < nVarsMax) {
      lVar14 = uVar18 - 1;
      auVar25._8_4_ = (int)lVar14;
      auVar25._0_8_ = lVar14;
      auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar15 = 0;
      auVar25 = auVar25 ^ _DAT_008403e0;
      do {
        pvVar2 = ppvVar5[uVar15];
        iVar19 = auVar25._0_4_;
        iVar21 = auVar25._4_4_;
        iVar22 = auVar25._12_4_;
        if (uVar15 < 5) {
          uVar1 = (&DAT_00997840)[uVar15];
          uVar17 = 0;
          auVar28 = auVar23;
          auVar27 = auVar24;
          do {
            auVar29 = auVar28 ^ auVar20;
            if ((bool)(~(auVar29._4_4_ == iVar21 && iVar19 < auVar29._0_4_ || iVar21 < auVar29._4_4_
                        ) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar17 * 4) = uVar1;
            }
            if ((auVar29._12_4_ != iVar22 || auVar29._8_4_ <= auVar25._8_4_) &&
                auVar29._12_4_ <= iVar22) {
              *(undefined4 *)((long)pvVar2 + uVar17 * 4 + 4) = uVar1;
            }
            iVar30 = SUB164(auVar27 ^ auVar20,4);
            if (iVar30 <= iVar21 && (iVar30 != iVar21 || SUB164(auVar27 ^ auVar20,0) <= iVar19)) {
              *(undefined4 *)((long)pvVar2 + uVar17 * 4 + 8) = uVar1;
              *(undefined4 *)((long)pvVar2 + uVar17 * 4 + 0xc) = uVar1;
            }
            uVar17 = uVar17 + 4;
            lVar14 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar14 + 4;
            lVar14 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar14 + 4;
          } while ((uVar3 + 3 & 0xfffffffc) != uVar17);
        }
        else {
          uVar16 = 1 << ((char)uVar15 - 5U & 0x1f);
          uVar17 = 0;
          auVar29 = auVar23;
          do {
            auVar28 = auVar29 ^ auVar20;
            if ((bool)(~(auVar28._4_4_ == iVar21 && iVar19 < auVar28._0_4_ || iVar21 < auVar28._4_4_
                        ) & 1)) {
              *(uint *)((long)pvVar2 + uVar17 * 4) = -(uint)((uVar16 & (uint)uVar17) != 0);
            }
            if ((auVar28._12_4_ != iVar22 || auVar28._8_4_ <= auVar25._8_4_) &&
                auVar28._12_4_ <= iVar22) {
              *(uint *)((long)pvVar2 + uVar17 * 4 + 4) = -(uint)(((uint)uVar17 + 1 & uVar16) != 0);
            }
            uVar17 = uVar17 + 2;
            lVar14 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar14 + 2;
          } while ((uVar3 + 1 & 0xfffffffe) != uVar17);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uint)nVarsMax);
    }
    pGVar4->vTruthVars = pVVar6;
    ppvVar7 = (void **)malloc(lVar8 * 0x200);
    ppvVar5 = ppvVar7 + 0x200;
    lVar8 = 0;
    if (nVarsMax < 6) {
      uVar13 = 0;
    }
    lVar14 = 0;
    lVar12 = 1;
    auVar24._8_4_ = (int)ppvVar5;
    auVar24._0_8_ = ppvVar5;
    auVar24._12_4_ = (int)((ulong)ppvVar5 >> 0x20);
    do {
      ppvVar7[lVar8] = (void *)((lVar14 << (ulong)uVar13) * 4 + (long)ppvVar5);
      (ppvVar7 + lVar8)[1] = (void *)(lVar12 * 4 + auVar24._8_8_);
      lVar8 = lVar8 + 2;
      lVar14 = lVar14 + 2;
      lVar12 = lVar12 + 2;
    } while (lVar8 != 0x200);
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 0x200;
    pVVar6->nSize = 0x200;
    pVVar6->pArray = ppvVar7;
    pGVar4->vTruthNodes = pVVar6;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 0x200;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(0x800);
    pVVar9->pArray = piVar10;
    pGVar4->vConeCare = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 0x200;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(0x800);
    pVVar9->pArray = piVar10;
    pGVar4->vConeData = pVVar9;
    puVar11 = (uint *)malloc(uVar18 << 2);
    pGVar4->pTruthIn = puVar11;
    puVar11 = (uint *)malloc(uVar18 << 2);
    pGVar4->pTruthOut = puVar11;
    return pGVar4;
  }
  __assert_fail("nVarsMax <= 20",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSupMin.c"
                ,0x43,"Gia_ManSup_t *Gia_ManSupStart(int)");
}

Assistant:

Gia_ManSup_t * Gia_ManSupStart( int nVarsMax )
{
    Gia_ManSup_t * p;
    assert( nVarsMax <= 20 );
    p = ABC_CALLOC( Gia_ManSup_t, 1 );
    p->nVarsMax    = nVarsMax;
    p->nWordsMax   = Kit_TruthWordNum( p->nVarsMax );
    p->vTruthVars  = Vec_PtrAllocTruthTables( p->nVarsMax );
    p->vTruthNodes = Vec_PtrAllocSimInfo( 512, p->nWordsMax );
    p->vConeCare   = Vec_IntAlloc( 512 );
    p->vConeData   = Vec_IntAlloc( 512 );
    p->pTruthIn    = ABC_ALLOC( unsigned, p->nWordsMax );
    p->pTruthOut   = ABC_ALLOC( unsigned, p->nWordsMax );
    return p;
}